

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O3

uint32_t WavpackUnpackSamples(WavpackContext *wpc,int32_t *buffer,uint32_t samples)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t sample_count;
  
  if (samples == 0) {
    uVar8 = 0;
  }
  else {
    iVar1 = (wpc->config).num_channels;
    uVar8 = 0;
    do {
      while (((uVar4 = (wpc->stream).wphdr.block_samples, uVar4 != 0 &&
              (((wpc->stream).wphdr.flags & 0x800) != 0)) &&
             ((wpc->stream).sample_index < (wpc->stream).wphdr.block_index + uVar4))) {
LAB_001b1f5e:
        if (((wpc->stream).wphdr.flags & 0x800) == 0) goto LAB_001b1fc8;
        uVar2 = (wpc->stream).wphdr.block_index;
        uVar3 = (wpc->stream).sample_index;
        sample_count = (uVar4 + uVar2) - uVar3;
        if (uVar4 + uVar2 < uVar3 || sample_count == 0) goto LAB_001b1fc8;
        uVar6 = uVar2 - uVar3;
        if (uVar3 <= uVar2 && uVar6 != 0) {
          if (samples <= uVar6) {
            uVar6 = samples;
          }
          (wpc->stream).sample_index = uVar3 + uVar6;
          uVar8 = uVar8 + uVar6;
          samples = samples - uVar6;
          iVar5 = wpc->reduced_channels;
          if (wpc->reduced_channels == 0) {
            iVar5 = iVar1;
          }
          uVar6 = iVar5 * uVar6;
          if (uVar6 != 0) {
            memset(buffer,0,(ulong)uVar6 << 2);
            buffer = buffer + (ulong)(uVar6 - 1) + 1;
          }
          goto LAB_001b1fc8;
        }
        if (samples <= sample_count) {
          sample_count = samples;
        }
        unpack_samples(wpc,buffer,sample_count);
        iVar5 = wpc->reduced_channels;
        if (wpc->reduced_channels == 0) {
          iVar5 = iVar1;
        }
        if (((wpc->stream).sample_index ==
             (wpc->stream).wphdr.block_samples + (wpc->stream).wphdr.block_index) &&
           (iVar7 = check_crc_error(wpc), iVar7 != 0)) {
          wpc->crc_errors = wpc->crc_errors + 1;
        }
        uVar8 = uVar8 + sample_count;
        if ((wpc->stream).sample_index == wpc->total_samples) {
          return uVar8;
        }
        buffer = buffer + iVar5 * sample_count;
        samples = samples - sample_count;
        if (samples == 0) {
          return uVar8;
        }
      }
      uVar4 = read_next_header(wpc->infile,&(wpc->stream).wphdr);
      if (uVar4 == 0xffffffff) {
        return uVar8;
      }
      uVar4 = (wpc->stream).wphdr.block_samples;
      if ((uVar4 != 0) && ((wpc->stream).sample_index != (wpc->stream).wphdr.block_index))
      goto LAB_001b1f5e;
      iVar5 = unpack_init(wpc);
      if (iVar5 == 0) {
        return uVar8;
      }
      uVar4 = (wpc->stream).wphdr.block_samples;
      if (uVar4 != 0) goto LAB_001b1f5e;
LAB_001b1fc8:
    } while (samples != 0);
  }
  return uVar8;
}

Assistant:

uint32_t WavpackUnpackSamples (WavpackContext *wpc, int32_t *buffer, uint32_t samples)
{
    WavpackStream *wps = &wpc->stream;
    uint32_t bcount, samples_unpacked = 0, samples_to_unpack;
    int num_channels = wpc->config.num_channels;

    while (samples) {
        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples) {
                bcount = read_next_header (wpc->infile, &wps->wphdr);

                if (bcount == (uint32_t) -1)
                    break;

                if (!wps->wphdr.block_samples || wps->sample_index == wps->wphdr.block_index)
                    if (!unpack_init (wpc))
                        break;
        }

        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples)
                continue;

        if (wps->sample_index < wps->wphdr.block_index) {
            samples_to_unpack = wps->wphdr.block_index - wps->sample_index;

            if (samples_to_unpack > samples)
                samples_to_unpack = samples;

            wps->sample_index += samples_to_unpack;
            samples_unpacked += samples_to_unpack;
            samples -= samples_to_unpack;

            if (wpc->reduced_channels)
                samples_to_unpack *= wpc->reduced_channels;
            else
                samples_to_unpack *= num_channels;

            while (samples_to_unpack--)
                *buffer++ = 0;

            continue;
        }

        samples_to_unpack = wps->wphdr.block_index + wps->wphdr.block_samples - wps->sample_index;

        if (samples_to_unpack > samples)
            samples_to_unpack = samples;

        unpack_samples (wpc, buffer, samples_to_unpack);

        if (wpc->reduced_channels)
            buffer += samples_to_unpack * wpc->reduced_channels;
        else
            buffer += samples_to_unpack * num_channels;

        samples_unpacked += samples_to_unpack;
        samples -= samples_to_unpack;

        if (wps->sample_index == wps->wphdr.block_index + wps->wphdr.block_samples) {
            if (check_crc_error (wpc))
                wpc->crc_errors++;
        }

        if (wps->sample_index == wpc->total_samples)
            break;
    }

    return samples_unpacked;
}